

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O3

bool Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::RescanObject
               (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *block,char *objectAddress,
               uint localObjectSize,uint objectIndex,Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  size_t sVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  
  if ((recycler->collectionState).value == CollectionStateParallelMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                       "this->collectionState != CollectionStateParallelMark");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  bVar4 = MarkContext::AddMarkedObject(&recycler->markContext,objectAddress,(ulong)localObjectSize);
  if (bVar4) {
    sVar3 = (recycler->collectionStats).markData.rescanObjectByteCount;
    auVar5 = pmovsxbq(in_XMM1,0x101);
    (recycler->collectionStats).markData.rescanObjectCount =
         auVar5._0_8_ + (recycler->collectionStats).markData.rescanObjectCount;
    (recycler->collectionStats).markData.rescanObjectByteCount = localObjectSize + sVar3;
  }
  return bVar4;
}

Assistant:

bool
SmallNormalHeapBlockT<TBlockAttributes>::RescanObject(SmallNormalHeapBlockT<TBlockAttributes>* block,
    __in_ecount(localObjectSize) char * objectAddress, uint localObjectSize,
    uint objectIndex, Recycler * recycler)
{
    // REVIEW: This would be a good assert to have but we don't have the heap block here
    // Assert(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (!recycler->AddMark(objectAddress, localObjectSize))
    {
        // Failed to add to the mark stack due to OOM.
        return false;
    }

    RECYCLER_STATS_INC(recycler, markData.rescanObjectCount);
    RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize);

    return true;
}